

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,ImDrawFlags flags,
          float thickness)

{
  uint uVar1;
  ImVec2 *pIVar2;
  ImVec4 *pIVar3;
  ImVec2 IVar4;
  ImDrawVert *pIVar5;
  ImVec2 *pIVar6;
  ImVec4 *pIVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  uint *puVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  float fVar27;
  ImVec2 IVar28;
  float fVar33;
  ImVec2 IVar29;
  ImVec2 IVar30;
  ImVec2 IVar31;
  ImVec2 IVar32;
  float fVar34;
  float fVar35;
  float fVar42;
  ImVec2 IVar36;
  ImVec2 IVar37;
  ImVec2 IVar38;
  ImVec2 IVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ImVec2 IVar43;
  ImVec2 IVar44;
  ImVec2 IVar45;
  ImVec2 IVar46;
  ImVec2 IVar47;
  ImVec2 IVar48;
  ImVec2 IVar49;
  long lStack_b0;
  
  if (col < 0x1000000 || points_count < 2) {
    return;
  }
  uVar24 = (ulong)(uint)points_count;
  uVar22 = points_count - 1;
  IVar4 = this->_Data->TexUvWhitePixel;
  uVar16 = points_count;
  if ((flags & 1U) == 0) {
    uVar16 = uVar22;
  }
  if ((this->Flags & 1U) == 0) {
    PrimReserve(this,uVar16 * 6,uVar16 << 2);
    for (uVar14 = 1; uVar14 - uVar16 != 1; uVar14 = uVar14 + 1) {
      uVar18 = uVar14 & 0xffffffff;
      if (uVar24 == uVar14) {
        uVar18 = 0;
      }
      fVar27 = points[uVar14 - 1].x;
      fVar34 = points[uVar18].x - fVar27;
      fVar33 = points[uVar14 - 1].y;
      auVar40._4_4_ = points[uVar18].y - fVar33;
      auVar40._0_4_ = fVar34 * fVar34 + auVar40._4_4_ * auVar40._4_4_;
      auVar40._8_8_ = 0;
      if (0.0 < auVar40._0_4_) {
        auVar41 = rsqrtss(auVar40,auVar40);
        auVar40._4_4_ = auVar40._4_4_ * auVar41._0_4_;
        fVar34 = fVar34 * auVar41._0_4_;
      }
      auVar40._4_4_ = auVar40._4_4_ * thickness * 0.5;
      fVar34 = fVar34 * thickness * 0.5;
      pIVar5 = this->_VtxWritePtr;
      IVar28.y = fVar33 - fVar34;
      IVar28.x = fVar27 + auVar40._4_4_;
      pIVar5->pos = IVar28;
      pIVar5->uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5->col = col;
      pIVar5[1].pos.x = points[uVar18].x + auVar40._4_4_;
      pIVar5[1].pos.y = points[uVar18].y - fVar34;
      pIVar5[1].uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[1].col = col;
      pIVar5[2].pos.x = points[uVar18].x - auVar40._4_4_;
      pIVar5[2].pos.y = points[uVar18].y + fVar34;
      pIVar5[2].uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[2].col = col;
      pIVar5[3].pos.x = points[uVar14 - 1].x - auVar40._4_4_;
      pIVar5[3].pos.y = points[uVar14 - 1].y + fVar34;
      pIVar5[3].uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[3].col = col;
      this->_VtxWritePtr = pIVar5 + 4;
      uVar22 = this->_VtxCurrentIdx;
      puVar19 = this->_IdxWritePtr;
      *puVar19 = uVar22;
      puVar19[1] = uVar22 + 1;
      puVar19[2] = this->_VtxCurrentIdx + 2;
      uVar22 = this->_VtxCurrentIdx;
      puVar19[3] = uVar22;
      puVar19[4] = uVar22 + 2;
      puVar19[5] = this->_VtxCurrentIdx + 3;
      this->_IdxWritePtr = puVar19 + 6;
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
    }
    return;
  }
  auVar40._4_4_ = thickness;
  if (thickness <= 1.0) {
    auVar40._4_4_ = 1.0;
  }
  iVar15 = (int)auVar40._4_4_;
  fVar34 = this->_FringeScale;
  bVar20 = fVar34 == 1.0 & iVar15 < 0x3f & (byte)this->Flags >> 1 &
           auVar40._4_4_ - (float)iVar15 <= 1e-05;
  iVar17 = 0x12;
  if (thickness <= fVar34) {
    iVar17 = 0xc;
  }
  iVar11 = 6;
  if (bVar20 == 0) {
    iVar11 = iVar17;
  }
  if (bVar20 == 1) {
    iVar17 = points_count * 2;
    iVar12 = 3;
  }
  else {
    iVar17 = points_count * 3;
    if (fVar34 < thickness) {
      iVar17 = points_count * 4;
    }
    iVar12 = (uint)(fVar34 < thickness) * 2 + 3;
  }
  uVar13 = col & 0xffffff;
  PrimReserve(this,iVar11 * uVar16,iVar17);
  ImVector<ImVec2>::reserve_discard(&this->_Data->TempBuffer,iVar12 * points_count);
  pIVar6 = (this->_Data->TempBuffer).Data;
  lVar25 = -(ulong)uVar16;
  for (uVar14 = 1; lVar25 + uVar14 != 1; uVar14 = uVar14 + 1) {
    uVar18 = uVar14 & 0xffffffff;
    if (uVar24 == uVar14) {
      uVar18 = 0;
    }
    fVar27 = points[uVar18].x - points[uVar14 - 1].x;
    fVar33 = points[uVar18].y - points[uVar14 - 1].y;
    auVar41._0_4_ = fVar27 * fVar27 + fVar33 * fVar33;
    auVar41._4_4_ = fVar33;
    auVar41._8_8_ = 0;
    if (0.0 < auVar41._0_4_) {
      auVar41 = rsqrtss(auVar41,auVar41);
      fVar27 = fVar27 * auVar41._0_4_;
      fVar33 = fVar33 * auVar41._0_4_;
    }
    pIVar6[uVar14 - 1].x = fVar33;
    pIVar6[uVar14 - 1].y = -fVar27;
  }
  pIVar2 = pIVar6 + uVar24;
  if ((flags & 1U) == 0) {
    pIVar6[uVar22] = pIVar2[-2];
    if (thickness <= fVar34 || bVar20 != 0) {
      if (bVar20 != 0) {
        fVar34 = auVar40._4_4_ * 0.5 + 1.0;
      }
      IVar29.x = (*points).x + (*pIVar6).x * fVar34;
      IVar29.y = (*points).y + (*pIVar6).y * fVar34;
      *pIVar2 = IVar29;
      IVar30.x = (*points).x - (*pIVar6).x * fVar34;
      IVar30.y = (*points).y - (*pIVar6).y * fVar34;
      pIVar2[1] = IVar30;
      IVar31.x = points[uVar22].x + pIVar6[uVar22].x * fVar34;
      IVar31.y = points[uVar22].y + pIVar6[uVar22].y * fVar34;
      pIVar2[uVar22 * 2] = IVar31;
      IVar9.y = points[uVar22].y - pIVar6[uVar22].y * fVar34;
      IVar9.x = points[uVar22].x - pIVar6[uVar22].x * fVar34;
      pIVar2[(ulong)(uVar22 * 2) + 1] = IVar9;
LAB_0017493d:
      puVar19 = this->_IdxWritePtr;
      uVar16 = this->_VtxCurrentIdx;
      for (uVar14 = 1; lVar25 + uVar14 != 1; uVar14 = uVar14 + 1) {
        uVar18 = uVar14 & 0xffffffff;
        if (uVar24 == uVar14) {
          uVar18 = 0;
        }
        uVar22 = uVar16 + (bVar20 ^ 3);
        if (uVar24 == uVar14) {
          uVar22 = this->_VtxCurrentIdx;
        }
        auVar40._4_4_ = (pIVar6[uVar18].x + pIVar6[uVar14 - 1].x) * 0.5;
        fVar27 = (pIVar6[uVar18].y + pIVar6[uVar14 - 1].y) * 0.5;
        fVar33 = auVar40._4_4_ * auVar40._4_4_ + fVar27 * fVar27;
        if (1e-06 < fVar33) {
          fVar33 = 1.0 / fVar33;
          fVar35 = 100.0;
          if (fVar33 <= 100.0) {
            fVar35 = fVar33;
          }
          auVar40._4_4_ = auVar40._4_4_ * fVar35;
          fVar27 = fVar27 * fVar35;
        }
        uVar26 = (ulong)(uint)((int)uVar18 * 2);
        IVar43.x = points[uVar18].x + auVar40._4_4_ * fVar34;
        IVar43.y = points[uVar18].y + fVar27 * fVar34;
        pIVar2[uVar26] = IVar43;
        IVar44.x = points[uVar18].x - auVar40._4_4_ * fVar34;
        IVar44.y = points[uVar18].y - fVar27 * fVar34;
        pIVar2[uVar26 + 1] = IVar44;
        *puVar19 = uVar22;
        puVar19[1] = uVar16;
        if (bVar20 == 0) {
          puVar19[2] = uVar16 + 2;
          puVar19[3] = uVar16 + 2;
          puVar19[4] = uVar22 + 2;
          puVar19[5] = uVar22;
          puVar19[6] = uVar22 + 1;
          puVar19[7] = uVar16 + 1;
          puVar19[8] = uVar16;
          puVar19[9] = uVar16;
          puVar19[10] = uVar22;
          puVar19[0xb] = uVar22 + 1;
          lStack_b0 = 0x30;
        }
        else {
          puVar19[2] = uVar16 + 1;
          puVar19[3] = uVar22 + 1;
          puVar19[4] = uVar16 + 1;
          puVar19[5] = uVar22;
          lStack_b0 = 0x18;
        }
        puVar19 = (uint *)((long)puVar19 + lStack_b0);
        this->_IdxWritePtr = puVar19;
        uVar16 = uVar22;
      }
      if (bVar20 == 0) {
        for (lVar25 = 0; uVar24 * 8 - lVar25 != 0; lVar25 = lVar25 + 8) {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar25);
          this->_VtxWritePtr->uv = IVar4;
          pIVar5 = this->_VtxWritePtr;
          pIVar5->col = col;
          pIVar5[1].pos = *(ImVec2 *)((long)&pIVar6[uVar24].x + lVar25 * 2);
          this->_VtxWritePtr[1].uv = IVar4;
          pIVar5 = this->_VtxWritePtr;
          pIVar5[1].col = uVar13;
          pIVar5[2].pos = *(ImVec2 *)((long)&pIVar6[uVar24 + 1].x + lVar25 * 2);
          this->_VtxWritePtr[2].uv = IVar4;
          pIVar5 = this->_VtxWritePtr;
          pIVar5[2].col = uVar13;
          this->_VtxWritePtr = pIVar5 + 3;
        }
      }
      else {
        pIVar7 = this->_Data->TexUvLines;
        pIVar3 = pIVar7 + iVar15;
        auVar40._4_4_ = pIVar3->x;
        fVar34 = pIVar3->y;
        pIVar7 = pIVar7 + iVar15;
        fVar27 = pIVar7->z;
        fVar33 = pIVar7->w;
        for (lVar25 = 0; uVar24 << 4 != lVar25; lVar25 = lVar25 + 0x10) {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)&pIVar6[uVar24].x + lVar25);
          pIVar5 = this->_VtxWritePtr;
          (pIVar5->uv).x = auVar40._4_4_;
          (pIVar5->uv).y = fVar34;
          pIVar5 = this->_VtxWritePtr;
          pIVar5->col = col;
          pIVar5[1].pos = *(ImVec2 *)((long)&pIVar6[uVar24 + 1].x + lVar25);
          pIVar5 = this->_VtxWritePtr;
          pIVar5[1].uv.x = fVar27;
          pIVar5[1].uv.y = fVar33;
          pIVar5 = this->_VtxWritePtr;
          pIVar5[1].col = col;
          this->_VtxWritePtr = pIVar5 + 2;
        }
      }
      goto LAB_00174e21;
    }
    auVar40._4_4_ = (auVar40._4_4_ - fVar34) * 0.5;
    fVar34 = fVar34 + auVar40._4_4_;
    IVar32.x = (*points).x + (*pIVar6).x * fVar34;
    IVar32.y = (*points).y + (*pIVar6).y * fVar34;
    *pIVar2 = IVar32;
    fVar27 = (*pIVar6).x;
    fVar35 = auVar40._4_4_ * fVar27;
    fVar33 = (*pIVar6).y;
    fVar42 = auVar40._4_4_ * fVar33;
    IVar45.x = (*points).x + fVar35;
    IVar45.y = (*points).y + fVar42;
    pIVar2[1] = IVar45;
    IVar46.x = (*points).x - fVar35;
    IVar46.y = (*points).y - fVar42;
    pIVar2[2] = IVar46;
    IVar36.x = (*points).x - fVar27 * fVar34;
    IVar36.y = (*points).y - fVar33 * fVar34;
    pIVar2[3] = IVar36;
    IVar37.x = points[uVar22].x + pIVar6[uVar22].x * fVar34;
    IVar37.y = points[uVar22].y + pIVar6[uVar22].y * fVar34;
    uVar14 = (ulong)(uVar22 * 4);
    pIVar2[uVar14] = IVar37;
    IVar38.x = points[uVar22].x + pIVar6[uVar22].x * auVar40._4_4_;
    IVar38.y = points[uVar22].y + pIVar6[uVar22].y * auVar40._4_4_;
    pIVar2[uVar14 + 1] = IVar38;
    IVar10.y = points[uVar22].y - pIVar6[uVar22].y * auVar40._4_4_;
    IVar10.x = points[uVar22].x - pIVar6[uVar22].x * auVar40._4_4_;
    pIVar2[uVar14 + 2] = IVar10;
    IVar8.y = points[uVar22].y - pIVar6[uVar22].y * fVar34;
    IVar8.x = points[uVar22].x - pIVar6[uVar22].x * fVar34;
    pIVar2[uVar14 + 3] = IVar8;
  }
  else {
    if ((thickness <= fVar34 | bVar20) == 1) {
      if (bVar20 != 0) {
        fVar34 = auVar40._4_4_ * 0.5 + 1.0;
      }
      goto LAB_0017493d;
    }
    auVar40._4_4_ = (auVar40._4_4_ - fVar34) * 0.5;
    fVar34 = fVar34 + auVar40._4_4_;
  }
  puVar19 = this->_IdxWritePtr;
  uVar16 = this->_VtxCurrentIdx;
  for (uVar14 = 1; lVar25 + uVar14 != 1; uVar14 = uVar14 + 1) {
    uVar18 = uVar14 & 0xffffffff;
    if (uVar24 == uVar14) {
      uVar18 = 0;
    }
    uVar22 = uVar16 + 4;
    if (uVar24 == uVar14) {
      uVar22 = this->_VtxCurrentIdx;
    }
    fVar27 = (pIVar6[uVar18].x + pIVar6[uVar14 - 1].x) * 0.5;
    fVar33 = (pIVar6[uVar18].y + pIVar6[uVar14 - 1].y) * 0.5;
    fVar35 = fVar27 * fVar27 + fVar33 * fVar33;
    if (1e-06 < fVar35) {
      fVar35 = 1.0 / fVar35;
      fVar42 = 100.0;
      if (fVar35 <= 100.0) {
        fVar42 = fVar35;
      }
      fVar27 = fVar27 * fVar42;
      fVar33 = fVar33 * fVar42;
    }
    uVar26 = (ulong)(uint)((int)uVar18 * 4);
    IVar47.x = points[uVar18].x + fVar34 * fVar27;
    IVar47.y = points[uVar18].y + fVar34 * fVar33;
    pIVar2[uVar26] = IVar47;
    IVar48.x = points[uVar18].x + fVar27 * auVar40._4_4_;
    IVar48.y = points[uVar18].y + fVar33 * auVar40._4_4_;
    pIVar2[uVar26 + 1] = IVar48;
    IVar49.x = points[uVar18].x - fVar27 * auVar40._4_4_;
    IVar49.y = points[uVar18].y - fVar33 * auVar40._4_4_;
    pIVar2[uVar26 + 2] = IVar49;
    IVar39.x = points[uVar18].x - fVar34 * fVar27;
    IVar39.y = points[uVar18].y - fVar34 * fVar33;
    pIVar2[uVar26 + 3] = IVar39;
    uVar23 = uVar22 + 1;
    *puVar19 = uVar23;
    puVar19[1] = uVar16 + 1;
    uVar1 = uVar16 + 2;
    puVar19[2] = uVar1;
    puVar19[3] = uVar1;
    uVar21 = uVar22 + 2;
    puVar19[4] = uVar21;
    puVar19[5] = uVar23;
    puVar19[6] = uVar23;
    puVar19[7] = uVar16 + 1;
    puVar19[8] = uVar16;
    puVar19[9] = uVar16;
    puVar19[10] = uVar22;
    puVar19[0xb] = uVar23;
    puVar19[0xc] = uVar21;
    puVar19[0xd] = uVar1;
    puVar19[0xe] = uVar16 + 3;
    puVar19[0xf] = uVar16 + 3;
    puVar19[0x10] = uVar22 + 3;
    puVar19[0x11] = uVar21;
    puVar19 = puVar19 + 0x12;
    this->_IdxWritePtr = puVar19;
    uVar16 = uVar22;
  }
  for (lVar25 = 0; uVar24 << 5 != lVar25; lVar25 = lVar25 + 0x20) {
    this->_VtxWritePtr->pos = *(ImVec2 *)((long)&pIVar6[uVar24].x + lVar25);
    this->_VtxWritePtr->uv = IVar4;
    pIVar5 = this->_VtxWritePtr;
    pIVar5->col = uVar13;
    pIVar5[1].pos = *(ImVec2 *)((long)&pIVar6[uVar24 + 1].x + lVar25);
    this->_VtxWritePtr[1].uv = IVar4;
    pIVar5 = this->_VtxWritePtr;
    pIVar5[1].col = col;
    pIVar5[2].pos = *(ImVec2 *)((long)&pIVar6[uVar24 + 2].x + lVar25);
    this->_VtxWritePtr[2].uv = IVar4;
    pIVar5 = this->_VtxWritePtr;
    pIVar5[2].col = col;
    pIVar5[3].pos = *(ImVec2 *)((long)&pIVar6[uVar24 + 3].x + lVar25);
    this->_VtxWritePtr[3].uv = IVar4;
    pIVar5 = this->_VtxWritePtr;
    pIVar5[3].col = uVar13;
    this->_VtxWritePtr = pIVar5 + 4;
  }
LAB_00174e21:
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + iVar17;
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, ImDrawFlags flags, float thickness)
{
    if (points_count < 2 || (col & IM_COL32_A_MASK) == 0)
        return;

    const bool closed = (flags & ImDrawFlags_Closed) != 0;
    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        _Data->TempBuffer.reserve_discard(points_count * ((use_texture || !thick_line) ? 3 : 5));
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}